

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soplex.hpp
# Opt level: O0

bool __thiscall
soplex::SoPlexBase<double>::parseSettingsString(SoPlexBase<double> *this,char *string)

{
  Verbosity VVar1;
  int iVar2;
  char *pcVar3;
  long lVar4;
  char *pcVar5;
  long in_RSI;
  SoPlexBase<double> *in_RDI;
  bool bVar6;
  Verbosity old_verbosity_13;
  Verbosity old_verbosity_12;
  Verbosity old_verbosity_11;
  unsigned_long parseval;
  uint value_2;
  Verbosity old_verbosity_10;
  Real value_1;
  Verbosity old_verbosity_9;
  int local_res100;
  Verbosity old_verbosity_8;
  int value;
  Verbosity old_verbosity_7;
  int local_res150;
  Verbosity old_verbosity_6;
  Verbosity old_verbosity_5;
  int param;
  Verbosity old_verbosity_4;
  char *paramValueString;
  Verbosity old_verbosity_3;
  Verbosity old_verbosity_2;
  char *paramName;
  Verbosity old_verbosity_1;
  Verbosity old_verbosity;
  char *paramTypeString;
  char *line;
  char parseString [500];
  bool success;
  size_t *in_stack_fffffffffffffc38;
  string *in_stack_fffffffffffffc40;
  SoPlexBase<double> *pSVar7;
  undefined8 in_stack_fffffffffffffc90;
  undefined7 in_stack_fffffffffffffc98;
  undefined1 in_stack_fffffffffffffc9f;
  ushort uVar8;
  RealParam in_stack_fffffffffffffca4;
  undefined1 uVar12;
  undefined2 uVar11;
  undefined3 uVar10;
  undefined1 in_stack_fffffffffffffcb2;
  undefined1 in_stack_fffffffffffffcb3;
  Verbosity in_stack_fffffffffffffcb4;
  Verbosity in_stack_fffffffffffffcb8;
  Verbosity in_stack_fffffffffffffcbc;
  Verbosity local_340 [3];
  allocator local_331;
  string local_330 [32];
  char *local_310;
  undefined4 local_308;
  Verbosity in_stack_fffffffffffffcfc;
  Verbosity in_stack_fffffffffffffd00;
  IntParam in_stack_fffffffffffffd04;
  SoPlexBase<double> *in_stack_fffffffffffffd08;
  Verbosity local_2d0;
  Verbosity local_2cc;
  int local_2c8;
  Verbosity local_2c4;
  Verbosity local_2c0 [5];
  allocator local_2a9;
  string local_2a8 [36];
  int local_284;
  Verbosity local_280;
  Verbosity local_27c;
  int local_278;
  Verbosity local_274;
  Verbosity local_270 [3];
  int local_264;
  Verbosity local_260;
  Verbosity local_25c;
  SoPlexBase<double> *local_258;
  Verbosity local_250;
  Verbosity local_24c [3];
  char *local_240;
  Verbosity local_238;
  Verbosity local_234 [3];
  char *local_228;
  SoPlexBase<double> *local_220;
  char local_218 [511];
  bool local_19;
  bool local_1;
  uint3 uVar9;
  
  local_19 = true;
  if (in_RSI == 0) {
    local_1 = false;
  }
  else {
    spxSnprintf(local_218,499,"%s",in_RSI);
    local_220 = (SoPlexBase<double> *)local_218;
    while( true ) {
      pSVar7 = local_220;
      uVar10 = (undefined3)in_stack_fffffffffffffca4;
      in_stack_fffffffffffffca4 = CONCAT13(1,uVar10);
      if ((*(char *)local_220 != ' ') &&
         (in_stack_fffffffffffffca4 = CONCAT13(1,uVar10), *(char *)local_220 != '\t')) {
        in_stack_fffffffffffffca4 = CONCAT13(*(char *)local_220 == '\r',uVar10);
      }
      if ((char)(in_stack_fffffffffffffca4 >> 0x18) == '\0') break;
      local_220 = (SoPlexBase<double> *)((long)local_220 + 1);
    }
    if (((*(char *)local_220 == '\0') || (*(char *)local_220 == '\n')) ||
       (*(char *)local_220 == '#')) {
      local_1 = true;
    }
    else {
      local_228 = (char *)local_220;
      while( true ) {
        uVar12 = (undefined1)(in_stack_fffffffffffffca4 >> 0x18);
        uVar8 = (ushort)in_stack_fffffffffffffca4;
        uVar9 = (uint3)uVar8;
        in_stack_fffffffffffffca4 = CONCAT13(uVar12,uVar9);
        if ((((*(char *)local_220 != ' ') &&
             (in_stack_fffffffffffffca4 = CONCAT13(uVar12,uVar9), *(char *)local_220 != '\t')) &&
            ((in_stack_fffffffffffffca4 = CONCAT13(uVar12,uVar9), *(char *)local_220 != '\r' &&
             ((in_stack_fffffffffffffca4 = CONCAT13(uVar12,uVar9), *(char *)local_220 != '\n' &&
              (in_stack_fffffffffffffca4 = CONCAT13(uVar12,uVar9), *(char *)local_220 != '#'))))))
           && (in_stack_fffffffffffffca4 = CONCAT13(uVar12,uVar9), *(char *)local_220 != '\0')) {
          in_stack_fffffffffffffca4 = CONCAT13(uVar12,CONCAT12(*(char *)local_220 != ':',uVar8));
        }
        if ((char)(in_stack_fffffffffffffca4 >> 0x10) == '\0') break;
        local_220 = (SoPlexBase<double> *)((long)local_220 + 1);
      }
      if (*(char *)local_220 == ':') {
        *(char *)local_220 = '\0';
        local_220 = (SoPlexBase<double> *)((long)local_220 + 1);
      }
      else {
        *(char *)local_220 = '\0';
        do {
          pcVar5 = (char *)local_220;
          local_220 = (SoPlexBase<double> *)(pcVar5 + 1);
          uVar11 = (undefined2)(in_stack_fffffffffffffca4 >> 0x10);
          in_stack_fffffffffffffca4 = CONCAT22(uVar11,0x100);
          if ((*(char *)local_220 != ' ') &&
             (in_stack_fffffffffffffca4 = CONCAT22(uVar11,0x100), *(char *)local_220 != '\t')) {
            in_stack_fffffffffffffca4 = (uint)CONCAT21(uVar11,*(char *)local_220 == '\r') << 8;
          }
        } while ((char)(in_stack_fffffffffffffca4 >> 8) != '\0');
        if (*(char *)local_220 != ':') {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
            local_234[2] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_234[1] = 3;
            SPxOut::setVerbosity(&in_RDI->spxout,local_234 + 1);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38
                              );
            SPxOut::setVerbosity(&in_RDI->spxout,local_234 + 2);
          }
          return false;
        }
        local_220 = (SoPlexBase<double> *)(pcVar5 + 2);
      }
      while( true ) {
        uVar10 = (undefined3)(in_stack_fffffffffffffca4 >> 8);
        in_stack_fffffffffffffca4 = CONCAT31(uVar10,1);
        if ((*(char *)local_220 != ' ') &&
           (in_stack_fffffffffffffca4 = CONCAT31(uVar10,1), *(char *)local_220 != '\t')) {
          in_stack_fffffffffffffca4 = CONCAT31(uVar10,*(char *)local_220 == '\r');
        }
        if ((char)in_stack_fffffffffffffca4 == '\0') break;
        local_220 = (SoPlexBase<double> *)((long)local_220 + 1);
      }
      if (((*(char *)local_220 == '\0') || (*(char *)local_220 == '\n')) ||
         (*(char *)local_220 == '#')) {
        if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
           (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
          local_234[0] = SPxOut::getVerbosity(&in_RDI->spxout);
          local_238 = INFO1;
          SPxOut::setVerbosity(&in_RDI->spxout,&local_238);
          soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38);
          SPxOut::setVerbosity(&in_RDI->spxout,local_234);
        }
        local_1 = false;
      }
      else {
        local_240 = (char *)local_220;
        while( true ) {
          bVar6 = false;
          if (((*(char *)local_220 != ' ') && (bVar6 = false, *(char *)local_220 != '\t')) &&
             ((bVar6 = false, *(char *)local_220 != '\r' &&
              (((bVar6 = false, *(char *)local_220 != '\n' &&
                (bVar6 = false, *(char *)local_220 != '#')) &&
               (bVar6 = false, *(char *)local_220 != '\0')))))) {
            bVar6 = *(char *)local_220 != '=';
          }
          if (!bVar6) break;
          local_220 = (SoPlexBase<double> *)((long)local_220 + 1);
        }
        if (*(char *)local_220 == '=') {
          *(char *)local_220 = '\0';
          local_220 = (SoPlexBase<double> *)((long)local_220 + 1);
        }
        else {
          *(char *)local_220 = '\0';
          do {
            pcVar5 = (char *)local_220;
            local_220 = (SoPlexBase<double> *)(pcVar5 + 1);
            bVar6 = true;
            if ((*(char *)local_220 != ' ') && (bVar6 = true, *(char *)local_220 != '\t')) {
              bVar6 = *(char *)local_220 == '\r';
            }
          } while (bVar6);
          if (*(char *)local_220 != '=') {
            if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
               (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
              local_24c[2] = SPxOut::getVerbosity(&in_RDI->spxout);
              local_24c[1] = 3;
              SPxOut::setVerbosity(&in_RDI->spxout,local_24c + 1);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                 (char *)in_stack_fffffffffffffc38);
              SPxOut::setVerbosity(&in_RDI->spxout,local_24c + 2);
            }
            return false;
          }
          local_220 = (SoPlexBase<double> *)(pcVar5 + 2);
        }
        while( true ) {
          bVar6 = true;
          if ((*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x20) &&
             (bVar6 = true, *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x9)) {
            bVar6 = *(_Alloc_hider *)&local_220->_vptr_SoPlexBase == (_Alloc_hider)0xd;
          }
          if (!bVar6) break;
          local_220 = (SoPlexBase<double> *)((_Alloc_hider *)&local_220->_vptr_SoPlexBase + 1);
        }
        if (((*(_Alloc_hider *)&local_220->_vptr_SoPlexBase == (_Alloc_hider)0x0) ||
            (*(_Alloc_hider *)&local_220->_vptr_SoPlexBase == (_Alloc_hider)0xa)) ||
           (*(_Alloc_hider *)&local_220->_vptr_SoPlexBase == (_Alloc_hider)0x23)) {
          if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
             (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
            local_24c[0] = SPxOut::getVerbosity(&in_RDI->spxout);
            local_250 = INFO1;
            SPxOut::setVerbosity(&in_RDI->spxout,&local_250);
            soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,(char *)in_stack_fffffffffffffc38
                              );
            SPxOut::setVerbosity(&in_RDI->spxout,local_24c);
          }
          local_1 = false;
        }
        else {
          local_258 = local_220;
          while( true ) {
            bVar6 = false;
            if (((*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x20) &&
                (bVar6 = false, *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x9))
               && ((bVar6 = false,
                   *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0xd &&
                   ((bVar6 = false,
                    *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0xa &&
                    (bVar6 = false,
                    *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x23)))))) {
              bVar6 = *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x0;
            }
            if (!bVar6) break;
            local_220 = (SoPlexBase<double> *)((_Alloc_hider *)&local_220->_vptr_SoPlexBase + 1);
          }
          if (*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x0) {
            *(_Alloc_hider *)&local_220->_vptr_SoPlexBase = (_Alloc_hider)0x0;
            do {
              local_220 = (SoPlexBase<double> *)((_Alloc_hider *)&local_220->_vptr_SoPlexBase + 1);
              bVar6 = true;
              if ((*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x20) &&
                 (bVar6 = true, *(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x9))
              {
                bVar6 = *(_Alloc_hider *)&local_220->_vptr_SoPlexBase == (_Alloc_hider)0xd;
              }
            } while (bVar6);
            if (((*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x0) &&
                (*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0xa)) &&
               (*(_Alloc_hider *)&local_220->_vptr_SoPlexBase != (_Alloc_hider)0x23)) {
              if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                 (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                local_25c = SPxOut::getVerbosity(&in_RDI->spxout);
                local_260 = INFO1;
                SPxOut::setVerbosity(&in_RDI->spxout,&local_260);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                   (char *)in_stack_fffffffffffffc38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                   (char)((ulong)in_stack_fffffffffffffc38 >> 0x38));
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                   (char *)in_stack_fffffffffffffc38);
                SPxOut::setVerbosity(&in_RDI->spxout,&local_25c);
              }
              return false;
            }
            in_stack_fffffffffffffc9f = 0;
          }
          iVar2 = strncmp((char *)pSVar7,"bool",4);
          if (iVar2 == 0) {
            for (local_264 = 0; local_264 < 0x1a; local_264 = local_264 + 1) {
              pcVar5 = local_240;
              pcVar3 = (char *)std::__cxx11::string::c_str();
              iVar2 = strncmp(pcVar5,pcVar3,500);
              if (iVar2 == 0) {
                iVar2 = strncasecmp((char *)local_258,"true",4);
                if ((((iVar2 == 0) || (iVar2 = strncasecmp((char *)local_258,"TRUE",4), iVar2 == 0))
                    || (iVar2 = strncasecmp((char *)local_258,"t",4), iVar2 == 0)) ||
                   ((iVar2 = strncasecmp((char *)local_258,"T",4), iVar2 == 0 ||
                    (lVar4 = strtol((char *)local_258,(char **)0x0,4), lVar4 == 1)))) {
                  local_19 = setBoolParam((SoPlexBase<double> *)
                                          CONCAT44(in_stack_fffffffffffffcbc,
                                                   in_stack_fffffffffffffcb8),
                                          in_stack_fffffffffffffcb4,(bool)in_stack_fffffffffffffcb3,
                                          (bool)in_stack_fffffffffffffcb2);
                }
                else {
                  iVar2 = strncasecmp((char *)local_258,"false",5);
                  if (((iVar2 == 0) ||
                      (iVar2 = strncasecmp((char *)local_258,"FALSE",5), iVar2 == 0)) ||
                     ((iVar2 = strncasecmp((char *)local_258,"f",5), iVar2 == 0 ||
                      ((iVar2 = strncasecmp((char *)local_258,"F",5), iVar2 == 0 ||
                       (lVar4 = strtol((char *)local_258,(char **)0x0,5), lVar4 == 0)))))) {
                    local_19 = setBoolParam((SoPlexBase<double> *)
                                            CONCAT44(in_stack_fffffffffffffcbc,
                                                     in_stack_fffffffffffffcb8),
                                            in_stack_fffffffffffffcb4,
                                            (bool)in_stack_fffffffffffffcb3,
                                            (bool)in_stack_fffffffffffffcb2);
                  }
                  else {
                    local_19 = false;
                  }
                }
                if (local_19 != false) {
                  return true;
                }
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                  local_270[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_274 = INFO1;
                  SPxOut::setVerbosity(&in_RDI->spxout,&local_274);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  SPxOut::setVerbosity(&in_RDI->spxout,local_270);
                }
                return false;
              }
            }
            if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
               (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
              local_270[2] = SPxOut::getVerbosity(&in_RDI->spxout);
              local_270[1] = 3;
              SPxOut::setVerbosity(&in_RDI->spxout,local_270 + 1);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                 (char *)in_stack_fffffffffffffc38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                 (char *)in_stack_fffffffffffffc38);
              soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                 (char *)in_stack_fffffffffffffc38);
              SPxOut::setVerbosity(&in_RDI->spxout,local_270 + 2);
            }
            local_1 = false;
          }
          else {
            iVar2 = strncmp(local_228,"int",3);
            if (iVar2 == 0) {
              for (local_278 = 0; pcVar5 = local_240, local_278 < 0x1c; local_278 = local_278 + 1) {
                pcVar3 = (char *)std::__cxx11::string::c_str();
                iVar2 = strncmp(pcVar5,pcVar3,500);
                pSVar7 = local_258;
                uVar12 = (undefined1)(in_stack_fffffffffffffcfc >> 0x18);
                if (iVar2 == 0) {
                  std::allocator<char>::allocator();
                  std::__cxx11::string::string(local_2a8,(char *)pSVar7,&local_2a9);
                  local_284 = std::__cxx11::stoi(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38
                                                 ,0);
                  std::__cxx11::string::~string(local_2a8);
                  std::allocator<char>::~allocator((allocator<char> *)&local_2a9);
                  bVar6 = setIntParam(in_stack_fffffffffffffd08,in_stack_fffffffffffffd04,
                                      in_stack_fffffffffffffd00,(bool)uVar12);
                  if (!bVar6) {
                    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                       (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                      local_2c0[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                      local_2c4 = INFO1;
                      SPxOut::setVerbosity(&in_RDI->spxout,&local_2c4);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                         (char *)in_stack_fffffffffffffc38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                         (char *)in_stack_fffffffffffffc38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                         (char *)in_stack_fffffffffffffc38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                         (char *)in_stack_fffffffffffffc38);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                         (char *)in_stack_fffffffffffffc38);
                      SPxOut::setVerbosity(&in_RDI->spxout,local_2c0);
                    }
                    return false;
                  }
                  return true;
                }
              }
              if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                 (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                local_27c = SPxOut::getVerbosity(&in_RDI->spxout);
                local_280 = INFO1;
                SPxOut::setVerbosity(&in_RDI->spxout,&local_280);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                   (char *)in_stack_fffffffffffffc38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                   (char *)in_stack_fffffffffffffc38);
                soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                   (char *)in_stack_fffffffffffffc38);
                SPxOut::setVerbosity(&in_RDI->spxout,&local_27c);
              }
              local_1 = false;
            }
            else {
              iVar2 = strncmp(local_228,"real",4);
              if (iVar2 == 0) {
                for (local_2c8 = 0; pcVar5 = local_240, local_2c8 < 0x1b; local_2c8 = local_2c8 + 1)
                {
                  pcVar3 = (char *)std::__cxx11::string::c_str();
                  iVar2 = strncmp(pcVar5,pcVar3,500);
                  pSVar7 = local_258;
                  uVar12 = (undefined1)((ulong)in_stack_fffffffffffffc90 >> 0x38);
                  if (iVar2 == 0) {
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string
                              ((string *)&stack0xfffffffffffffd08,(char *)pSVar7,
                               (allocator *)&stack0xfffffffffffffd07);
                    std::__cxx11::stod(in_stack_fffffffffffffc40,in_stack_fffffffffffffc38);
                    std::__cxx11::string::~string((string *)&stack0xfffffffffffffd08);
                    std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffd07);
                    bVar6 = setRealParam(in_RDI,in_stack_fffffffffffffca4,
                                         (Real)CONCAT17(in_stack_fffffffffffffc9f,
                                                        in_stack_fffffffffffffc98),(bool)uVar12);
                    if (!bVar6) {
                      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                         (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                        SPxOut::getVerbosity(&in_RDI->spxout);
                        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffcfc);
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                           (char *)in_stack_fffffffffffffc38);
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                           (char *)in_stack_fffffffffffffc38);
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                           (char *)in_stack_fffffffffffffc38);
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                           (char *)in_stack_fffffffffffffc38);
                        soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                           (char *)in_stack_fffffffffffffc38);
                        SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffd00);
                      }
                      return false;
                    }
                    return true;
                  }
                }
                if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                   (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                  local_2cc = SPxOut::getVerbosity(&in_RDI->spxout);
                  local_2d0 = INFO1;
                  SPxOut::setVerbosity(&in_RDI->spxout,&local_2d0);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                     (char *)in_stack_fffffffffffffc38);
                  SPxOut::setVerbosity(&in_RDI->spxout,&local_2cc);
                }
                local_1 = false;
              }
              else {
                iVar2 = strncmp(local_228,"uint",4);
                if (iVar2 == 0) {
                  iVar2 = strncmp(local_240,"random_seed",0xb);
                  if (iVar2 == 0) {
                    pSVar7 = local_258;
                    std::allocator<char>::allocator();
                    std::__cxx11::string::string(local_330,(char *)pSVar7,&local_331);
                    pcVar5 = (char *)std::__cxx11::stoul((string *)pSVar7,in_stack_fffffffffffffc38,
                                                         0);
                    local_310 = pcVar5;
                    std::__cxx11::string::~string(local_330);
                    std::allocator<char>::~allocator((allocator<char> *)&local_331);
                    if (local_310 < (char *)0x100000000) {
                      local_308 = SUB84(local_310,0);
                    }
                    else {
                      local_308 = 0xffffffff;
                      if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                         (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 0 < (int)VVar1)) {
                        local_340[2] = SPxOut::getVerbosity(&in_RDI->spxout);
                        local_340[1] = 1;
                        SPxOut::setVerbosity(&in_RDI->spxout,local_340 + 1);
                        soplex::operator<<((SPxOut *)pSVar7,pcVar5);
                        SPxOut::setVerbosity(&in_RDI->spxout,local_340 + 2);
                      }
                    }
                    setRandomSeed(pSVar7,(uint)((ulong)pcVar5 >> 0x20));
                    local_1 = true;
                  }
                  else {
                    if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                       (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                      local_340[0] = SPxOut::getVerbosity(&in_RDI->spxout);
                      SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffcbc);
                      soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                         (char *)in_stack_fffffffffffffc38);
                      SPxOut::setVerbosity(&in_RDI->spxout,local_340);
                    }
                    local_1 = false;
                  }
                }
                else {
                  if ((in_RDI != (SoPlexBase<double> *)0xfffffffffffffff8) &&
                     (VVar1 = SPxOut::getVerbosity(&in_RDI->spxout), 2 < (int)VVar1)) {
                    SPxOut::getVerbosity(&in_RDI->spxout);
                    SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffcb4);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                       (char *)in_stack_fffffffffffffc38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                       (char *)in_stack_fffffffffffffc38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                       (char *)in_stack_fffffffffffffc38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                       (char *)in_stack_fffffffffffffc38);
                    soplex::operator<<((SPxOut *)in_stack_fffffffffffffc40,
                                       (char *)in_stack_fffffffffffffc38);
                    SPxOut::setVerbosity(&in_RDI->spxout,(Verbosity *)&stack0xfffffffffffffcb8);
                  }
                  local_1 = false;
                }
              }
            }
          }
        }
      }
    }
  }
  return local_1;
}

Assistant:

bool SoPlexBase<R>::parseSettingsString(char* string)
{
   assert(string != nullptr);

   bool success = true;

   if(string == nullptr)
      return false;

   char parseString[SPX_SET_MAX_LINE_LEN];
   spxSnprintf(parseString, SPX_SET_MAX_LINE_LEN - 1, "%s", string);

   char* line = parseString;

   // find the start of the parameter type
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
      return true;

   char* paramTypeString = line;

   // find the end of the parameter type
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != ':')
      line++;

   if(*line == ':')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the ':' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != ':')
      {
         SPX_MSG_INFO1(spxout, spxout <<
                       "Error parsing setting string: no ':' separating parameter type and name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter name
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter name.\n");
      return false;
   }

   char* paramName = line;

   // find the end of the parameter name
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0' && *line != '=')
      line++;

   if(*line == '=')
   {
      *line = '\0';
      line++;
   }
   else
   {
      *line = '\0';
      line++;

      // search for the '=' char in the line
      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '=')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no '=' after parameter name.\n");
         return false;
      }

      line++;
   }

   // find the start of the parameter value string
   while(*line == ' ' || *line == '\t' || *line == '\r')
      line++;

   if(*line == '\0' || *line == '\n' || *line == '#')
   {
      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: no parameter value.\n");
      return false;
   }

   char* paramValueString = line;

   // find the end of the parameter value string
   while(*line != ' ' && *line != '\t' && *line != '\r' && *line != '\n' && *line != '#'
         && *line != '\0')
      line++;

   if(*line != '\0')
   {
      // check, if the rest of the line is clean
      *line = '\0';
      line++;

      while(*line == ' ' || *line == '\t' || *line == '\r')
         line++;

      if(*line != '\0' && *line != '\n' && *line != '#')
      {
         SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: additional character '" << *line <<
                       "' after parameter value.\n");
         return false;
      }
   }

   // check whether we have a bool parameter
   if(strncmp(paramTypeString, "bool", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::BOOLPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->boolParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            if(strncasecmp(paramValueString, "true", 4) == 0
                  || strncasecmp(paramValueString, "TRUE", 4) == 0
                  || strncasecmp(paramValueString, "t", 4) == 0
                  || strncasecmp(paramValueString, "T", 4) == 0
                  || strtol(paramValueString, nullptr, 4) == 1)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, true);
            else if(strncasecmp(paramValueString, "false", 5) == 0
                    || strncasecmp(paramValueString, "FALSE", 5) == 0
                    || strncasecmp(paramValueString, "f", 5) == 0
                    || strncasecmp(paramValueString, "F", 5) == 0
                    || strtol(paramValueString, nullptr, 5) == 0)
               success = setBoolParam((SoPlexBase<R>::BoolParam)param, false);
            else
               success = false;

            if(success)
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for bool parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have an integer parameter
   if(strncmp(paramTypeString, "int", 3) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::INTPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->intParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            int value;
            value = std::stoi(paramValueString);

            if(setIntParam((SoPlexBase<R>::IntParam)param, value, false))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for int parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

   // check whether we have a real parameter
   if(strncmp(paramTypeString, "real", 4) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::REALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->realParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Real value;
#ifdef WITH_LONG_DOUBLE
            value = std::stold(paramValueString);
#else
#ifdef WITH_FLOAT
            value = std::stof(paramValueString);
#else
            value = std::stod(paramValueString);
#endif
#endif

            if(setRealParam((SoPlexBase<R>::RealParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for real parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#ifdef SOPLEX_WITH_RATIONALPARAM

   // check whether we have a rational parameter
   if(strncmp(paramTypeString, "rational", 8) == 0)
   {
      for(int param = 0; ; param++)
      {
         if(param >= SoPlexBase<R>::RATIONALPARAM_COUNT)
         {
            SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: unknown parameter name <" <<
                          paramName << ">.\n");
            return false;
         }
         else if(strncmp(paramName, _currentSettings->rationalParam.name[param].c_str(),
                         SPX_SET_MAX_LINE_LEN) == 0)
         {
            Rational value;

            if(readStringRational(paramValueString, value)
                  && setRationalParam((SoPlexBase<R>::RationalParam)param, value))
               break;
            else
            {
               SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid value <" << paramValueString
                             << "> for rational parameter <" << paramName << ">.\n");
               return false;
            }
         }
      }

      return true;
   }

#endif

   // check whether we have the random seed
   if(strncmp(paramTypeString, "uint", 4) == 0)
   {
      if(strncmp(paramName, "random_seed", 11) == 0)
      {
         unsigned int value;
         unsigned long parseval;

         parseval = std::stoul(paramValueString);

         if(parseval > UINT_MAX)
         {
            value = UINT_MAX;
            SPX_MSG_WARNING(spxout, spxout << "Converting number greater than UINT_MAX to uint.\n");
         }
         else
            value = (unsigned int) parseval;

         setRandomSeed(value);
         return true;
      }

      SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string for uint parameter <random_seed>.\n");
      return false;
   }

   SPX_MSG_INFO1(spxout, spxout << "Error parsing setting string: invalid parameter type <" <<
                 paramTypeString << "> for parameter <" << paramName << ">.\n");

   return false;
}